

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketMath.h
# Opt level: O3

double ear::distance(Vector3d *position)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  dVar3 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  dVar1 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  return SQRT(dVar1 * dVar1 + dVar3 * dVar3 + dVar2 * dVar2);
}

Assistant:

EIGEN_STRONG_INLINE Packet2d ploadu<Packet2d>(const double* from)
{
  EIGEN_DEBUG_UNALIGNED_LOAD
  return _mm_loadu_pd(from);
}